

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  second_type pSVar1;
  char *in_RCX;
  FileDescriptorTables *local_50;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  
  p.second = (SourceCodeInfo *)&stack0xffffffffffffffb0;
  local_50 = this;
  p.first = (FileDescriptorTables *)info;
  std::
  call_once<void(&)(std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*),std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>*>
            (&this->locations_by_path_once_,BuildLocationsByPath,
             (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
              **)&p.second);
  Join<std::vector<int,std::allocator<int>>>
            ((string *)&p.second,(protobuf *)path,(vector<int,_std::allocator<int>_> *)",",in_RCX);
  pSVar1 = FindPtrOrNull<std::unordered_map<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>>
                     (&this->locations_by_path_,(first_type *)&p.second);
  std::__cxx11::string::~string((string *)&p.second);
  return pSVar1;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  internal::call_once(locations_by_path_once_,
                      FileDescriptorTables::BuildLocationsByPath, &p);
  return FindPtrOrNull(locations_by_path_, Join(path, ","));
}